

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

bool __thiscall QSequentialAnimationGroupPrivate::atEnd(QSequentialAnimationGroupPrivate *this)

{
  parameter_type pVar1;
  parameter_type pVar2;
  parameter_type pVar3;
  parameter_type pVar4;
  int iVar5;
  QList<QAbstractAnimation_*> *this_00;
  QAbstractAnimation **ppQVar6;
  QSequentialAnimationGroupPrivate *in_RDI;
  int animTotalCurrentTime;
  undefined1 local_d;
  
  QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
            ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
              *)0x689c43);
  QAbstractAnimationPrivate::get((QAbstractAnimation *)0x689c4b);
  pVar1 = ::QObjectCompatProperty::operator_cast_to_int
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                      *)0x689c5a);
  pVar2 = ::QObjectCompatProperty::operator_cast_to_int
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                      *)0x689c6f);
  pVar3 = QObjectBindableProperty::operator_cast_to_int
                    ((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                      *)0x689c84);
  local_d = false;
  if (pVar2 == pVar3 + -1) {
    pVar4 = ::QObjectCompatProperty::operator_cast_to_Direction
                      ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                        *)0x689ca5);
    local_d = false;
    if (pVar4 == Forward) {
      this_00 = (QList<QAbstractAnimation_*> *)
                QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                          ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                            *)0x689cc3);
      ppQVar6 = QList<QAbstractAnimation_*>::last(this_00);
      local_d = false;
      if (this_00 == (QList<QAbstractAnimation_*> *)*ppQVar6) {
        iVar5 = animationActualTotalDuration(in_RDI,(int)((ulong)this_00 >> 0x20));
        local_d = pVar1 == iVar5;
      }
    }
  }
  return local_d;
}

Assistant:

bool QSequentialAnimationGroupPrivate::atEnd() const
{
    // we try to detect if we're at the end of the group
    //this is true if the following conditions are true:
    // 1. we're in the last loop
    // 2. the direction is forward
    // 3. the current animation is the last one
    // 4. the current animation has reached its end
    const int animTotalCurrentTime = QAbstractAnimationPrivate::get(currentAnimation)->totalCurrentTime;
    return (currentLoop == loopCount - 1
        && direction == QAbstractAnimation::Forward
        && currentAnimation == animations.last()
        && animTotalCurrentTime == animationActualTotalDuration(currentAnimationIndex));
}